

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CursorImpl.cpp
# Opt level: O3

bool __thiscall
sf::priv::CursorImpl::loadFromPixelsMonochrome
          (CursorImpl *this,Uint8 *pixels,Vector2u size,Vector2u hotspot)

{
  byte *pbVar1;
  Display *pDVar2;
  ulong uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  Cursor CVar6;
  byte bVar7;
  size_type __n;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  Uint8 *pUVar12;
  ulong uVar13;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> mask;
  XColor fg;
  XColor bg;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_80;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  allocator_type local_50 [8];
  undefined4 local_48;
  undefined2 local_44;
  allocator_type local_40 [8];
  undefined4 local_38;
  undefined2 local_34;
  
  uVar11 = (ulong)size >> 0x20;
  uVar13 = (ulong)(size.x + 7 >> 3);
  __n = uVar13 * uVar11;
  local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_68,__n,(value_type_conflict3 *)&local_80,local_50);
  local_50[0] = (allocator_type)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_80,__n,(value_type_conflict3 *)local_50,local_40);
  if (uVar11 != 0) {
    uVar3 = (ulong)size & 0xffffffff;
    pUVar12 = pixels + 3;
    uVar8 = 0;
    do {
      if (uVar3 != 0) {
        uVar9 = 0;
        do {
          lVar10 = (uVar9 >> 3) + uVar8 * uVar13;
          bVar7 = (byte)uVar9 & 7;
          local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[lVar10] =
               local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start[lVar10] | (pUVar12[uVar9 * 4] != '\0') << bVar7;
          pbVar1 = (byte *)(CONCAT71(local_80.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     local_80.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_1_) + lVar10);
          *pbVar1 = *pbVar1 | (0x182 < (uint)pUVar12[uVar9 * 4 + -1] +
                                       (uint)pUVar12[uVar9 * 4 + -2] + (uint)pUVar12[uVar9 * 4 + -3]
                              ) << bVar7;
          uVar9 = uVar9 + 1;
        } while (uVar3 != uVar9);
      }
      uVar8 = uVar8 + 1;
      pUVar12 = pUVar12 + uVar3 * 4;
    } while (uVar8 != uVar11);
  }
  pDVar2 = this->m_display;
  uVar4 = XDefaultRootWindow(pDVar2);
  uVar4 = XCreateBitmapFromData
                    (pDVar2,uVar4,
                     local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,(ulong)size & 0xffffffff,uVar11);
  pDVar2 = this->m_display;
  uVar5 = XDefaultRootWindow(pDVar2);
  uVar5 = XCreateBitmapFromData
                    (pDVar2,uVar5,
                     CONCAT71(local_80.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start._1_7_,
                              local_80.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start._0_1_),
                     (ulong)size & 0xffffffff,uVar11);
  local_48 = 0xffffffff;
  local_44 = 0xffff;
  local_38 = 0;
  local_34 = 0;
  CVar6 = XCreatePixmapCursor(this->m_display,uVar5,uVar4);
  this->m_cursor = CVar6;
  XFreePixmap(this->m_display,uVar5);
  XFreePixmap(this->m_display,uVar4);
  if ((void *)CONCAT71(local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start._1_7_,
                       local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start._0_1_) != (void *)0x0) {
    operator_delete((void *)CONCAT71(local_80.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     local_80.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_1_));
  }
  if (local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return true;
}

Assistant:

bool CursorImpl::loadFromPixelsMonochrome(const Uint8* pixels, Vector2u size, Vector2u hotspot)
{
    // Convert the image into a bitmap (monochrome!).
    // The bit data is stored packed into bytes. If the number of pixels on each row of the image
    // does not fit exactly into (width/8) bytes, one extra byte is allocated at the end of each
    // row to store the extra pixels.
    std::size_t packedWidth = (size.x + 7) / 8;
    std::size_t bytes = packedWidth * size.y;
    std::vector<Uint8> mask(bytes, 0); // Defines which pixel is opaque (1) or transparent (0).
    std::vector<Uint8> data(bytes, 0); // Defines which pixel is white (1) or black (0).

    for (std::size_t j = 0; j < size.y; ++j)
    {
        for (std::size_t i = 0; i < size.x; ++i)
        {
            std::size_t pixelIndex = i + j * size.x;
            std::size_t byteIndex  = i / 8 + j * packedWidth;
            std::size_t bitIndex   = i % 8;

            // Turn on pixel that are not transparent
            Uint8 opacity = pixels[pixelIndex * 4 + 3] > 0 ? 1 : 0;
            mask[byteIndex] |= static_cast<Uint8>(opacity << bitIndex);

            // Choose between black/background & white/foreground color for each pixel,
            // based on the pixel color intensity: on average, if a channel is "active"
            // at 50%, the bit is white.
            int intensity = (pixels[pixelIndex * 4 + 0] + pixels[pixelIndex * 4 + 1] + pixels[pixelIndex * 4 + 2]) / 3;
            Uint8 bit = intensity > 128 ? 1 : 0;
            data[byteIndex] |= static_cast<Uint8>(bit << bitIndex);
        }
    }

    Pixmap maskPixmap = XCreateBitmapFromData(m_display, XDefaultRootWindow(m_display),
                                              reinterpret_cast<char*>(&mask[0]), size.x, size.y);
    Pixmap dataPixmap = XCreateBitmapFromData(m_display, XDefaultRootWindow(m_display),
                                              reinterpret_cast<char*>(&data[0]), size.x, size.y);

    // Define the foreground color as white and the background as black.
    XColor fg, bg;
    fg.red   = 0xFFFF;
    fg.blue  = 0xFFFF;
    fg.green = 0xFFFF;
    bg.red   = 0x0000;
    bg.blue  = 0x0000;
    bg.green = 0x0000;

    // Create the monochrome cursor.
    m_cursor = XCreatePixmapCursor(m_display,
                                   dataPixmap, maskPixmap,
                                   &fg, &bg,
                                   hotspot.x, hotspot.y);

    // Free the resources
    XFreePixmap(m_display, dataPixmap);
    XFreePixmap(m_display, maskPixmap);

    // We assume everything went fine...
    return true;
}